

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Command::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Command *this,PatternList *left)

{
  pointer pbVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pointer __n;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer psVar7;
  unsigned_long uVar8;
  long lVar9;
  bool bVar10;
  undefined1 local_a1;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *local_a0;
  Command *local_98;
  undefined1 local_90 [8];
  undefined1 local_88 [17];
  undefined7 uStack_77;
  undefined8 uStack_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  pointer local_50;
  pointer local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar9 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = __return_storage_ptr__;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 4;
    psVar7 = (left->
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0;
    local_98 = this;
    do {
      peVar2 = (psVar7->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        lVar6 = 0;
      }
      else {
        lVar6 = __dynamic_cast(peVar2,&Pattern::typeinfo,&Argument::typeinfo,0);
      }
      if (lVar6 != 0) {
        iVar5 = (*(local_98->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
        lVar9 = *(long *)CONCAT44(extraout_var,iVar5);
        local_50 = (pointer)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,lVar9,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar9);
        __n = local_48;
        pbVar1 = (pointer)(local_88 + 0x10);
        local_90._0_4_ = String;
        if (local_50 == (pointer)&local_40) {
          uStack_70 = uStack_38;
          local_88._0_8_ = pbVar1;
        }
        else {
          local_88._0_8_ = local_50;
        }
        uStack_77 = uStack_3f;
        local_88[0x10] = local_40;
        local_88._8_8_ = local_48;
        local_48 = (pointer)0x0;
        local_40 = 0;
        if ((*(int *)(lVar6 + 0x28) == 3) && (__n == *(pointer *)(lVar6 + 0x38))) {
          if (__n == (pointer)0x0) {
            bVar10 = true;
            local_50 = (pointer)&local_40;
          }
          else {
            local_50 = (pointer)&local_40;
            iVar5 = bcmp((void *)local_88._0_8_,*(void **)(lVar6 + 0x30),(size_t)__n);
            bVar10 = iVar5 == 0;
          }
        }
        else {
          bVar10 = false;
          local_50 = (pointer)&local_40;
        }
        if (local_90._0_4_ == StringList) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_88);
        }
        else if ((local_90._0_4_ == String) && ((pointer)local_88._0_8_ != pbVar1)) {
          operator_delete((void *)local_88._0_8_,
                          (ulong)((long)&(((pointer)stack0xffffffffffffff88)->_M_dataplus)._M_p + 1)
                         );
        }
        if (local_50 != (pointer)&local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        if (!bVar10) {
          return local_a0;
        }
        local_a0->first = uVar8;
        iVar5 = (*(local_98->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
        local_90._0_4_ = Bool;
        local_88[0] = 1;
        local_68 = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Command,std::allocator<docopt::Command>,std::__cxx11::string_const&,docopt::value>
                  (a_Stack_60,(Command **)&local_68,(allocator<docopt::Command> *)&local_a1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar5),(value *)local_90);
        _Var4._M_pi = a_Stack_60[0]._M_pi;
        peVar3 = local_68;
        local_68 = (element_type *)0x0;
        a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (local_a0->second).
                  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (local_a0->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar3;
        (local_a0->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var4._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
        }
        if (local_90._0_4_ == StringList) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_88);
          return local_a0;
        }
        if (local_90._0_4_ != String) {
          return local_a0;
        }
        if ((pointer)local_88._0_8_ == pbVar1) {
          return local_a0;
        }
        operator_delete((void *)local_88._0_8_,
                        (ulong)((long)&(((pointer)stack0xffffffffffffff88)->_M_dataplus)._M_p + 1));
        return local_a0;
      }
      uVar8 = uVar8 + 1;
      psVar7 = psVar7 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != uVar8);
  }
  return local_a0;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Command::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				if (name() == arg->getValue()) {
					ret.first = i;
					ret.second = std::make_shared<Command>(name(), value{true});
				}
				break;
			}
		}

		return ret;
	}